

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigAssignDist1(Ivy_FraigMan_t *p,uint *pPat)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  Ivy_Man_t *pIVar4;
  ulong uVar5;
  bool bVar6;
  
  pIVar4 = p->pManAig;
  pVVar2 = pIVar4->vPis;
  if (0 < pVVar2->nSize) {
    uVar5 = 0;
    do {
      Ivy_NodeAssignConst(p,(Ivy_Obj_t *)pVVar2->pArray[uVar5],
                          (uint)((pPat[uVar5 >> 5 & 0x7ffffff] >> ((uint)uVar5 & 0x1f) & 1) != 0));
      uVar5 = uVar5 + 1;
      pIVar4 = p->pManAig;
      pVVar2 = pIVar4->vPis;
    } while ((long)uVar5 < (long)pVVar2->nSize);
  }
  uVar3 = p->nSimWords * 0x20 - 1;
  if (pIVar4->nObjs[1] < (int)uVar3) {
    uVar3 = pIVar4->nObjs[1];
  }
  if (0 < (int)uVar3) {
    uVar5 = 1;
    do {
      if ((long)pVVar2->nSize <= (long)(uVar5 - 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)(*(long *)((long)pVVar2->pArray[uVar5 - 1] + 0x20) + 0x20 +
                       (uVar5 >> 5 & 0x7ffffff) * 4);
      *puVar1 = *puVar1 ^ 1 << ((byte)uVar5 & 0x1f);
      bVar6 = uVar5 != uVar3;
      uVar5 = uVar5 + 1;
    } while (bVar6);
  }
  return;
}

Assistant:

void Ivy_FraigAssignDist1( Ivy_FraigMan_t * p, unsigned * pPat )
{
    Ivy_Obj_t * pObj;
    int i, Limit;
    Ivy_ManForEachPi( p->pManAig, pObj, i )
    {
        Ivy_NodeAssignConst( p, pObj, Ivy_InfoHasBit(pPat, i) );
//        printf( "%d", Ivy_InfoHasBit(pPat, i) );
    }
//    printf( "\n" );

    Limit = IVY_MIN( Ivy_ManPiNum(p->pManAig), p->nSimWords * 32 - 1 );
    for ( i = 0; i < Limit; i++ )
        Ivy_InfoXorBit( Ivy_ObjSim( Ivy_ManPi(p->pManAig,i) )->pData, i+1 );
}